

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O0

lzma_ret hash_append(lzma_index_hash_info *info,lzma_vli unpadded_size,lzma_vli uncompressed_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  lzma_vli lVar3;
  lzma_vli local_38;
  lzma_vli sizes [2];
  lzma_vli uncompressed_size_local;
  lzma_vli unpadded_size_local;
  lzma_index_hash_info *info_local;
  
  lVar3 = vli_ceil4(unpadded_size);
  info->blocks_size = lVar3 + info->blocks_size;
  info->uncompressed_size = uncompressed_size + info->uncompressed_size;
  uVar1 = lzma_vli_size(unpadded_size);
  uVar2 = lzma_vli_size(uncompressed_size);
  info->index_list_size = (ulong)(uVar1 + uVar2) + info->index_list_size;
  info->count = info->count + 1;
  local_38 = unpadded_size;
  sizes[0] = uncompressed_size;
  lzma_check_update(&info->check,LZMA_CHECK_SHA256,(uint8_t *)&local_38,0x10);
  return LZMA_OK;
}

Assistant:

static lzma_ret
hash_append(lzma_index_hash_info *info, lzma_vli unpadded_size,
		lzma_vli uncompressed_size)
{
	info->blocks_size += vli_ceil4(unpadded_size);
	info->uncompressed_size += uncompressed_size;
	info->index_list_size += lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);
	++info->count;

	const lzma_vli sizes[2] = { unpadded_size, uncompressed_size };
	lzma_check_update(&info->check, LZMA_CHECK_BEST,
			(const uint8_t *)(sizes), sizeof(sizes));

	return LZMA_OK;
}